

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-stack.cpp
# Opt level: O1

void __thiscall wasm::BinaryInstWriter::mapLocalsAndEmitHeader(BinaryInstWriter *this)

{
  mapped_type mVar1;
  Function *this_00;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __seed;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> __last;
  pointer pTVar2;
  BufferWithRandomAccess *pBVar3;
  bool bVar4;
  uint uVar5;
  Index IVar6;
  Index IVar7;
  size_t sVar8;
  mapped_type *pmVar9;
  ulong uVar10;
  __buckets_ptr pp_Var11;
  Type *pTVar12;
  long lVar13;
  mapped_type *pmVar14;
  mapped_type *pmVar15;
  iterator iVar16;
  __buckets_ptr __n;
  size_t __n_00;
  void *__buf;
  void *extraout_RDX;
  void *__buf_00;
  void *pvVar17;
  void *extraout_RDX_00;
  void *__buf_01;
  mapped_type mVar18;
  ulong uVar19;
  __node_base_ptr p_Var20;
  _Hash_node_base *p_Var21;
  pointer pTVar22;
  uint uVar23;
  Type *type_1;
  pair<std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>,_bool> pVar24;
  undefined1 local_e8 [8];
  InsertOrderedMap<wasm::Type,_unsigned_int> scratches;
  key_type local_90;
  _Hash_node_base local_88;
  undefined1 local_80 [8];
  unordered_map<wasm::Type,_unsigned_int,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
  nextFreeIndex;
  undefined1 local_40 [8];
  Type type;
  
  if (this->func == (Function *)0x0) {
    __assert_fail("func && \"BinaryInstWriter: function is not set\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/wasm-stack.cpp"
                  ,0xabf,"void wasm::BinaryInstWriter::mapLocalsAndEmitHeader()");
  }
  sVar8 = Function::getNumParams(this->func);
  if (sVar8 != 0) {
    uVar23 = 1;
    mVar18 = 0;
    do {
      local_e8._0_4_ = uVar23 - 1;
      local_e8._4_4_ = 0;
      pmVar9 = std::__detail::
               _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)this,(key_type *)local_e8);
      *pmVar9 = mVar18;
      mVar18 = (mapped_type)uVar23;
      sVar8 = Function::getNumParams(this->func);
      uVar23 = uVar23 + 1;
    } while (mVar18 < sVar8);
  }
  countScratchLocals((InsertOrderedMap<wasm::Type,_unsigned_int> *)local_e8,this);
  this_00 = this->func;
  if (this->DWARF == false) {
    p_Var20 = (__node_base_ptr)
              (this_00->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
              super__Vector_impl_data._M_start;
    nextFreeIndex._M_h._M_single_bucket =
         (__node_base_ptr)
         (this_00->vars).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
         super__Vector_impl_data._M_finish;
    p_Var21 = scratches.Map._M_h._M_single_bucket;
    if (p_Var20 != nextFreeIndex._M_h._M_single_bucket) {
      do {
        local_40 = (undefined1  [8])p_Var20->_M_nxt;
        nextFreeIndex._M_h._M_buckets = (__buckets_ptr)0x0;
        local_80 = (undefined1  [8])local_40;
        pp_Var11 = (__buckets_ptr)wasm::Type::size((Type *)local_40);
        if (nextFreeIndex._M_h._M_buckets == pp_Var11) goto LAB_00cb0e76;
        do {
          do {
            pTVar12 = wasm::Type::Iterator::operator*((Iterator *)local_80);
            noteLocalType(this,(Type)pTVar12->id,1);
            nextFreeIndex._M_h._M_buckets = (__buckets_ptr)((long)nextFreeIndex._M_h._M_buckets + 1)
            ;
          } while (nextFreeIndex._M_h._M_buckets != pp_Var11);
LAB_00cb0e76:
        } while (local_80 != (undefined1  [8])local_40);
        p_Var20 = p_Var20 + 1;
        p_Var21 = scratches.Map._M_h._M_single_bucket;
      } while (p_Var20 != nextFreeIndex._M_h._M_single_bucket);
    }
    for (; p_Var21 != (_Hash_node_base *)&scratches.Map._M_h._M_single_bucket;
        p_Var21 = p_Var21->_M_nxt) {
      noteLocalType(this,(Type)p_Var21[2]._M_nxt,*(Index *)&p_Var21[3]._M_nxt);
    }
    if (((this->parent->wasm->features).features & 0x100) != 0) {
      __seed._M_current =
           (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
      __last._M_current =
           (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__seed._M_current == __last._M_current) {
        local_40 = (undefined1  [8])((ulong)(uint7)local_40._1_7_ << 8);
      }
      else {
        local_40[0] = ((__seed._M_current)->id & 1) == 0 && 6 < (__seed._M_current)->id;
        lVar13 = (long)__last._M_current - (long)__seed._M_current >> 3;
        std::
        _Temporary_buffer<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_wasm::Type>
        ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>,_wasm::Type>
                             *)local_80,__seed,(lVar13 - (lVar13 + 1 >> 0x3f)) + 1 >> 1);
        if (nextFreeIndex._M_h._M_bucket_count == 0) {
          std::
          __inplace_stable_sort<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,__gnu_cxx::__ops::_Iter_comp_iter<wasm::BinaryInstWriter::mapLocalsAndEmitHeader()::__0>>
                    (__seed,__last,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_stack_cpp:2821:60)>
                      )local_40);
        }
        else {
          std::
          __stable_sort_adaptive<__gnu_cxx::__normal_iterator<wasm::Type*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,wasm::Type*,long,__gnu_cxx::__ops::_Iter_comp_iter<wasm::BinaryInstWriter::mapLocalsAndEmitHeader()::__0>>
                    (__seed,__last,(Type *)nextFreeIndex._M_h._M_bucket_count,
                     (long)nextFreeIndex._M_h._M_buckets,
                     (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_wasm_wasm_stack_cpp:2821:60)>
                      )local_40);
        }
        operator_delete((void *)nextFreeIndex._M_h._M_bucket_count,
                        (long)nextFreeIndex._M_h._M_buckets << 3);
      }
    }
    local_80 = (undefined1  [8])&nextFreeIndex._M_h._M_rehash_policy._M_next_resize;
    nextFreeIndex._M_h._M_buckets = (__buckets_ptr)0x1;
    nextFreeIndex._M_h._M_bucket_count = 0;
    nextFreeIndex._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    nextFreeIndex._M_h._M_element_count._0_4_ = 0x3f800000;
    nextFreeIndex._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    nextFreeIndex._M_h._M_rehash_policy._4_4_ = 0;
    nextFreeIndex._M_h._M_rehash_policy._M_next_resize = 0;
    IVar6 = Function::getVarIndexBase(this->func);
    pTVar22 = (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
              .super__Vector_impl_data._M_start;
    pTVar2 = (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar22 != pTVar2) {
      do {
        pmVar14 = std::__detail::
                  _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_80,pTVar22);
        *pmVar14 = IVar6;
        pmVar15 = std::__detail::
                  _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&this->numLocalsByType,pTVar22);
        IVar6 = IVar6 + (int)*pmVar15;
        pTVar22 = pTVar22 + 1;
      } while (pTVar22 != pTVar2);
    }
    IVar6 = Function::getVarIndexBase(this->func);
    while( true ) {
      sVar8 = Function::getNumLocals(this->func);
      __n_00 = (size_t)IVar6;
      if (sVar8 <= __n_00) break;
      local_88._M_nxt = (_Hash_node_base *)Function::getLocalType(this->func,IVar6);
      type.id = 0;
      local_40 = (undefined1  [8])&local_88;
      sVar8 = wasm::Type::size((Type *)&local_88);
      if ((type.id != sVar8) || (local_40 != (undefined1  [8])&local_88)) {
        nextFreeIndex._M_h._M_single_bucket =
             (__node_base_ptr)((ulong)nextFreeIndex._M_h._M_single_bucket & 0xffffffff00000000);
        scratches.List.
        super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
        ._M_impl._M_node._M_size = sVar8;
        do {
          do {
            pTVar12 = wasm::Type::Iterator::operator*((Iterator *)local_40);
            pmVar14 = std::__detail::
                      _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                      ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                    *)local_80,pTVar12);
            uVar23 = *pmVar14;
            *pmVar14 = uVar23 + 1;
            uVar5 = (Index)nextFreeIndex._M_h._M_single_bucket;
            local_90.second = (Index)nextFreeIndex._M_h._M_single_bucket;
            local_90.first = IVar6;
            pmVar9 = std::__detail::
                     _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)this,&local_90);
            nextFreeIndex._M_h._M_single_bucket =
                 (__node_base_ptr)CONCAT44(nextFreeIndex._M_h._M_single_bucket._4_4_,uVar5 + 1);
            *pmVar9 = (ulong)uVar23;
            type.id = type.id + 1;
          } while (type.id !=
                   scratches.List.
                   super__List_base<std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>_>
                   ._M_impl._M_node._M_size);
        } while (local_40 != (undefined1  [8])&local_88);
      }
      IVar6 = IVar6 + 1;
    }
    pvVar17 = extraout_RDX_00;
    if (scratches.Map._M_h._M_single_bucket != (__node_base_ptr)&scratches.Map._M_h._M_single_bucket
       ) {
      p_Var21 = scratches.Map._M_h._M_single_bucket;
      do {
        pmVar14 = std::__detail::
                  _Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)local_80,(key_type *)(p_Var21 + 2));
        mVar1 = *pmVar14;
        local_40 = (undefined1  [8])p_Var21[2]._M_nxt;
        type.id = type.id & 0xffffffff00000000;
        pVar24 = InsertOrderedMap<wasm::Type,_unsigned_int>::insert
                           (&this->scratchLocals,(pair<const_wasm::Type,_unsigned_int> *)local_40);
        pvVar17 = pVar24._8_8_;
        *(mapped_type *)&pVar24.first._M_node._M_node[1]._M_prev = mVar1;
        p_Var21 = p_Var21->_M_nxt;
      } while (p_Var21 != (_Hash_node_base *)&scratches.Map._M_h._M_single_bucket);
    }
    local_40._0_4_ = (int)(this->numLocalsByType)._M_h._M_element_count;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)local_40,(int)this->o,pvVar17,__n_00);
    pTVar22 = (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
              .super__Vector_impl_data._M_start;
    pTVar2 = (this->localTypes).super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pTVar22 != pTVar2) {
      do {
        pBVar3 = this->o;
        iVar16 = std::
                 _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_long>,_std::allocator<std::pair<const_wasm::Type,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::find(&(this->numLocalsByType)._M_h,pTVar22);
        if (iVar16.super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_long>,_true>.
            _M_cur == (__node_type *)0x0) {
          std::__throw_out_of_range("_Map_base::at");
        }
        local_40._0_4_ =
             *(undefined4 *)
              ((long)iVar16.
                     super__Node_iterator_base<std::pair<const_wasm::Type,_unsigned_long>,_true>.
                     _M_cur + 0x10);
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)local_40,(int)pBVar3,__buf_01,__n_00);
        WasmBinaryWriter::writeType(this->parent,(Type)pTVar22->id);
        pTVar22 = pTVar22 + 1;
      } while (pTVar22 != pTVar2);
    }
    std::
    _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_unsigned_int>,_std::allocator<std::pair<const_wasm::Type,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                   *)local_80);
  }
  else {
    IVar6 = Function::getVarIndexBase(this_00);
    IVar7 = Function::getVarIndexBase(this->func);
    while( true ) {
      sVar8 = Function::getNumLocals(this->func);
      if (sVar8 <= IVar7) break;
      local_80 = (undefined1  [8])Function::getLocalType(this->func,IVar7);
      sVar8 = wasm::Type::size((Type *)local_80);
      nextFreeIndex._M_h._M_single_bucket =
           (__node_base_ptr)CONCAT44(nextFreeIndex._M_h._M_single_bucket._4_4_,IVar7);
      if (sVar8 != 0) {
        uVar10 = 0;
        uVar19 = 1;
        do {
          local_80 = (undefined1  [8])(uVar10 << 0x20 | (ulong)IVar7);
          pmVar9 = std::__detail::
                   _Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::pair<unsigned_int,_unsigned_int>,_std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>,_std::allocator<std::pair<const_std::pair<unsigned_int,_unsigned_int>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::pair<unsigned_int,_unsigned_int>_>,_std::hash<std::pair<unsigned_int,_unsigned_int>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,(key_type *)local_80);
          uVar10 = (ulong)IVar6;
          IVar6 = IVar6 + 1;
          *pmVar9 = uVar10;
          bVar4 = uVar19 < sVar8;
          uVar10 = uVar19;
          uVar19 = (ulong)((int)uVar19 + 1);
        } while (bVar4);
      }
      IVar7 = (Index)nextFreeIndex._M_h._M_single_bucket + 1;
    }
    IVar7 = Function::getVarIndexBase(this->func);
    uVar23 = (IVar6 - IVar7) + (int)scratches.Map._M_h._M_before_begin._M_nxt;
    local_80._0_4_ = uVar23;
    LEB<unsigned_int,_unsigned_char>::write
              ((LEB<unsigned_int,_unsigned_char> *)local_80,(int)this->o,__buf,(ulong)uVar23);
    IVar7 = Function::getVarIndexBase(this->func);
    nextFreeIndex._M_h._M_single_bucket =
         (__node_base_ptr)CONCAT44(nextFreeIndex._M_h._M_single_bucket._4_4_,IVar7);
    while( true ) {
      pp_Var11 = (__buckets_ptr)Function::getNumLocals(this->func);
      __n = (__buckets_ptr)((ulong)nextFreeIndex._M_h._M_single_bucket & 0xffffffff);
      if (pp_Var11 <= __n) break;
      local_40 = (undefined1  [8])
                 Function::getLocalType(this->func,(Index)nextFreeIndex._M_h._M_single_bucket);
      nextFreeIndex._M_h._M_buckets = (__buckets_ptr)0x0;
      local_80 = (undefined1  [8])local_40;
      pp_Var11 = (__buckets_ptr)wasm::Type::size((Type *)local_40);
      if (nextFreeIndex._M_h._M_buckets == pp_Var11) goto LAB_00cb0f74;
      do {
        do {
          pTVar12 = wasm::Type::Iterator::operator*((Iterator *)local_80);
          local_88._M_nxt._0_4_ = 1;
          LEB<unsigned_int,_unsigned_char>::write
                    ((LEB<unsigned_int,_unsigned_char> *)&local_88,(int)this->o,__buf_00,(size_t)__n
                    );
          WasmBinaryWriter::writeType(this->parent,(Type)pTVar12->id);
          __n = (__buckets_ptr)((long)nextFreeIndex._M_h._M_buckets + 1);
          nextFreeIndex._M_h._M_buckets = __n;
        } while (__n != pp_Var11);
LAB_00cb0f74:
      } while (local_80 != (undefined1  [8])local_40);
      nextFreeIndex._M_h._M_single_bucket =
           (__node_base_ptr)
           CONCAT44(nextFreeIndex._M_h._M_single_bucket._4_4_,
                    (Index)nextFreeIndex._M_h._M_single_bucket + 1);
    }
    if (scratches.Map._M_h._M_single_bucket != (__node_base_ptr)&scratches.Map._M_h._M_single_bucket
       ) {
      pvVar17 = extraout_RDX;
      p_Var21 = scratches.Map._M_h._M_single_bucket;
      do {
        local_80._0_4_ = *(uint *)&p_Var21[3]._M_nxt;
        LEB<unsigned_int,_unsigned_char>::write
                  ((LEB<unsigned_int,_unsigned_char> *)local_80,(int)this->o,pvVar17,(size_t)__n);
        WasmBinaryWriter::writeType(this->parent,(Type)p_Var21[2]._M_nxt);
        local_80 = *(undefined1 (*) [8])(p_Var21 + 2);
        nextFreeIndex._M_h._M_buckets =
             (__buckets_ptr)((ulong)nextFreeIndex._M_h._M_buckets & 0xffffffff00000000);
        pVar24 = InsertOrderedMap<wasm::Type,_unsigned_int>::insert
                           (&this->scratchLocals,(pair<const_wasm::Type,_unsigned_int> *)local_80);
        pvVar17 = pVar24._8_8_;
        *(Index *)&pVar24.first._M_node._M_node[1]._M_prev = IVar6;
        IVar6 = IVar6 + *(int *)&p_Var21[3]._M_nxt;
        p_Var21 = p_Var21->_M_nxt;
      } while (p_Var21 != (_Hash_node_base *)&scratches.Map._M_h._M_single_bucket);
    }
  }
  while (scratches.Map._M_h._M_single_bucket !=
         (__node_base_ptr)&scratches.Map._M_h._M_single_bucket) {
    p_Var21 = (scratches.Map._M_h._M_single_bucket)->_M_nxt;
    operator_delete(scratches.Map._M_h._M_single_bucket,0x20);
    scratches.Map._M_h._M_single_bucket = p_Var21;
  }
  std::
  _Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Type,_std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>,_std::allocator<std::pair<const_wasm::Type,_std::_List_iterator<std::pair<const_wasm::Type,_unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Type>,_std::hash<wasm::Type>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_e8);
  return;
}

Assistant:

void BinaryInstWriter::mapLocalsAndEmitHeader() {
  assert(func && "BinaryInstWriter: function is not set");
  // Map params
  for (Index i = 0; i < func->getNumParams(); i++) {
    mappedLocals[std::make_pair(i, 0)] = i;
  }

  auto scratches = countScratchLocals();

  // Normally we map all locals of the same type into a range of adjacent
  // addresses, which is more compact. However, if we need to keep DWARF valid,
  // do not do any reordering at all - instead, do a trivial mapping that
  // keeps everything unmoved.
  //
  // Unless we have run DWARF-invalidating passes, all locals added during the
  // process that are not in DWARF info (tuple locals, tuple scratch locals,
  // locals to resolve stacky format, ..) have been all tacked on to the
  // existing locals and happen at the end, so as long as we print the local
  // types in order, we don't invalidate original local DWARF info here.
  if (DWARF) {
    Index mappedIndex = func->getVarIndexBase();
    for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
      size_t size = func->getLocalType(i).size();
      for (Index j = 0; j < size; j++) {
        mappedLocals[std::make_pair(i, j)] = mappedIndex++;
      }
    }

    size_t numBinaryLocals =
      mappedIndex - func->getVarIndexBase() + scratches.size();

    o << U32LEB(numBinaryLocals);

    for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
      for (const auto& type : func->getLocalType(i)) {
        o << U32LEB(1);
        parent.writeType(type);
      }
    }
    for (auto& [type, count] : scratches) {
      o << U32LEB(count);
      parent.writeType(type);
      scratchLocals[type] = mappedIndex;
      mappedIndex += count;
    }
    return;
  }

  for (auto type : func->vars) {
    for (const auto& t : type) {
      noteLocalType(t);
    }
  }

  for (auto& [type, count] : scratches) {
    noteLocalType(type, count);
  }

  if (parent.getModule()->features.hasReferenceTypes()) {
    // Sort local types in a way that keeps all MVP types together and all
    // reference types together. E.g. it is helpful to avoid a block of i32s in
    // between blocks of different reference types, since clearing out reference
    // types may require different work.
    //
    // See https://github.com/WebAssembly/binaryen/issues/4773
    //
    // In order to decide whether to put MVP types or reference types first,
    // look at the type of the first local. In an optimized binary we will have
    // sorted the locals by frequency of uses, so this way we'll keep the most
    // commonly-used local at the top, which should work well in many cases.
    bool refsFirst = !localTypes.empty() && localTypes[0].isRef();
    std::stable_sort(localTypes.begin(), localTypes.end(), [&](Type a, Type b) {
      if (refsFirst) {
        return a.isRef() && !b.isRef();
      } else {
        return !a.isRef() && b.isRef();
      }
    });
  }

  // Map IR (local index, tuple index) pairs to binary local indices. Since
  // locals are grouped by type, start by calculating the base indices for each
  // type.
  std::unordered_map<Type, Index> nextFreeIndex;
  Index baseIndex = func->getVarIndexBase();
  for (auto& type : localTypes) {
    nextFreeIndex[type] = baseIndex;
    baseIndex += numLocalsByType[type];
  }

  // Map the IR index pairs to indices.
  for (Index i = func->getVarIndexBase(); i < func->getNumLocals(); i++) {
    Index j = 0;
    for (const auto& type : func->getLocalType(i)) {
      mappedLocals[{i, j++}] = nextFreeIndex[type]++;
    }
  }

  // Map scratch locals to the remaining indices.
  for (auto& [type, _] : scratches) {
    scratchLocals[type] = nextFreeIndex[type];
  }

  o << U32LEB(numLocalsByType.size());
  for (auto& localType : localTypes) {
    o << U32LEB(numLocalsByType.at(localType));
    parent.writeType(localType);
  }
}